

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O0

void __thiscall
ear::PolarSpeakerPosition::PolarSpeakerPosition
          (PolarSpeakerPosition *this,PolarSpeakerPosition *param_1)

{
  PolarSpeakerPosition *param_1_local;
  PolarSpeakerPosition *this_local;
  
  memcpy(this,param_1,0x78);
  ScreenEdgeLock::ScreenEdgeLock(&this->screenEdgeLock,&param_1->screenEdgeLock);
  return;
}

Assistant:

struct EAR_EXPORT PolarSpeakerPosition {
    PolarSpeakerPosition(double az = 0.0, double el = 0.0, double dist = 1.0)
        : azimuth(az), elevation(el), distance(dist){};
    double azimuth;
    boost::optional<double> azimuthMin;
    boost::optional<double> azimuthMax;
    double elevation;
    boost::optional<double> elevationMin;
    boost::optional<double> elevationMax;
    double distance;
    boost::optional<double> distanceMin;
    boost::optional<double> distanceMax;
    ScreenEdgeLock screenEdgeLock;
  }